

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O2

uint32_t base58_get_checksum(uchar *bytes,size_t bytes_len)

{
  sha256 sha;
  
  wally_sha256d(bytes,bytes_len,(uchar *)&sha,0x20);
  wally_clear(&sha,0x20);
  return sha.u.u32[0];
}

Assistant:

uint32_t base58_get_checksum(const unsigned char *bytes, size_t bytes_len)
{
    struct sha256 sha;
    uint32_t checksum;

    wally_sha256d(bytes, bytes_len, (unsigned char *)&sha, sizeof(sha));
    checksum = sha.u.u32[0];
    wally_clear(&sha, sizeof(sha));
    return checksum;
}